

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

ssize_t nw_in_read(void *reader_ctx,uchar *buf,size_t len,CURLcode *err)

{
  int err_00;
  long lVar1;
  Curl_easy *pCVar2;
  Curl_cfilter *cf;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  char buffer [256];
  char acStack_138 [264];
  
  lVar1 = *(long *)(*reader_ctx + 0x10);
  *err = CURLE_OK;
  uVar3 = recv(*(int *)(lVar1 + 0x98),buf,len,0);
  if (uVar3 == 0xffffffffffffffff) {
    piVar4 = __errno_location();
    err_00 = *piVar4;
    if ((err_00 == 0xb) || (err_00 == 4)) {
      *err = CURLE_AGAIN;
    }
    else {
      pCVar2 = *(Curl_easy **)((long)reader_ctx + 8);
      pcVar5 = Curl_strerror(err_00,acStack_138,0x100);
      Curl_failf(pCVar2,"Recv failure: %s",pcVar5);
      *(int *)(*(long *)((long)reader_ctx + 8) + 0xd0c) = err_00;
      *err = CURLE_RECV_ERROR;
    }
  }
  pCVar2 = *(Curl_easy **)((long)reader_ctx + 8);
  if ((((pCVar2 != (Curl_easy *)0x0) && (((pCVar2->set).field_0x8bd & 0x10) != 0)) &&
      (cf = *reader_ctx, cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
    Curl_trc_cf_infof(pCVar2,cf,"nw_in_read(len=%zu) -> %d, err=%d",len,uVar3 & 0xffffffff,
                      (ulong)*err);
  }
  return uVar3;
}

Assistant:

static ssize_t nw_in_read(void *reader_ctx,
                           unsigned char *buf, size_t len,
                           CURLcode *err)
{
  struct reader_ctx *rctx = reader_ctx;
  struct cf_socket_ctx *ctx = rctx->cf->ctx;
  ssize_t nread;

  *err = CURLE_OK;
  nread = sread(ctx->sock, buf, len);

  if(-1 == nread) {
    int sockerr = SOCKERRNO;

    if(
#ifdef WSAEWOULDBLOCK
      /* This is how Windows does it */
      (WSAEWOULDBLOCK == sockerr)
#else
      /* errno may be EWOULDBLOCK or on some systems EAGAIN when it returned
         due to its inability to send off data without blocking. We therefore
         treat both error codes the same here */
      (EWOULDBLOCK == sockerr) || (EAGAIN == sockerr) || (EINTR == sockerr)
#endif
      ) {
      /* this is just a case of EWOULDBLOCK */
      *err = CURLE_AGAIN;
      nread = -1;
    }
    else {
      char buffer[STRERROR_LEN];

      failf(rctx->data, "Recv failure: %s",
            Curl_strerror(sockerr, buffer, sizeof(buffer)));
      rctx->data->state.os_errno = sockerr;
      *err = CURLE_RECV_ERROR;
      nread = -1;
    }
  }
  CURL_TRC_CF(rctx->data, rctx->cf, "nw_in_read(len=%zu) -> %d, err=%d",
              len, (int)nread, *err);
  return nread;
}